

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O2

bool __thiscall Qentem::QExpression::operator>(QExpression *this,uint number)

{
  QExpression *pQVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  undefined1 in_ZMM1 [64];
  
  if (this->Type != IntegerNumber) {
    if (this->Type == NaturalNumber) {
      pQVar1 = (this->field_0).SubExpressions.storage_;
      bVar3 = pQVar1 < (QExpression *)(ulong)number;
      bVar4 = pQVar1 == (QExpression *)(ulong)number;
    }
    else {
      auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,number);
      bVar4 = *(double *)&this->field_0 == auVar2._0_8_;
      bVar3 = *(double *)&this->field_0 < auVar2._0_8_;
    }
    return !bVar3 && !bVar4;
  }
  return (long)(ulong)number < (long)(this->field_0).SubExpressions.storage_;
}

Assistant:

bool operator>(const Number_T number) const noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                return (Value.Number.Natural > SizeT64(number));
            }

            case ExpressionType::IntegerNumber: {
                return (Value.Number.Integer > SizeT64I(number));
            }

            default: {
                return (Value.Number.Real > double(number));
            }
        }
    }